

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O3

void __thiscall HEkkDualRow::chooseMakepack(HEkkDualRow *this,HVector *row,HighsInt offset)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer pdVar7;
  long lVar8;
  HighsInt HVar9;
  
  iVar2 = row->count;
  if (0 < (long)iVar2) {
    piVar4 = (row->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (row->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    HVar9 = this->packCount;
    lVar8 = 0;
    do {
      iVar3 = piVar4[lVar8];
      dVar1 = pdVar5[iVar3];
      piVar6[HVar9] = iVar3 + offset;
      iVar3 = this->packCount;
      HVar9 = iVar3 + 1;
      this->packCount = HVar9;
      pdVar7[iVar3] = dVar1;
      lVar8 = lVar8 + 1;
    } while (iVar2 != lVar8);
  }
  return;
}

Assistant:

void HEkkDualRow::chooseMakepack(const HVector* row, const HighsInt offset) {
  /**
   * Pack the indices and values for the row
   *
   * Offset of numCol is used when packing row_ep
   */
  const HighsInt rowCount = row->count;
  const HighsInt* rowIndex = row->index.data();
  const double* rowArray = row->array.data();
  for (HighsInt i = 0; i < rowCount; i++) {
    const HighsInt index = rowIndex[i];
    const double value = rowArray[index];
    packIndex[packCount] = index + offset;
    packValue[packCount++] = value;
  }
}